

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeUMinInst
          (GraphicsRobustAccessPass *this,TypeManager *tm,Instruction *x,Instruction *y,
          Instruction *where)

{
  uint32_t uVar1;
  uint32_t result_id;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  Type *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Instruction *pIVar6;
  undefined4 uVar7;
  long lVar8;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  uint32_t local_1b8;
  uint32_t local_1b4;
  uint local_1b0;
  uint32_t local_1ac;
  SmallVector<unsigned_int,_2UL> local_1a8;
  SmallVector<unsigned_int,_2UL> local_180;
  SmallVector<unsigned_int,_2UL> local_158;
  SmallVector<unsigned_int,_2UL> local_130;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined1 local_f0 [48];
  undefined4 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  uVar1 = GetGlslInsts(this);
  result_id = Pass::TakeNextId(&this->super_Pass);
  uVar2 = Instruction::type_id(x);
  pTVar5 = analysis::TypeManager::GetType(tm,uVar2);
  iVar3 = (*pTVar5->_vptr_Type[9])(pTVar5);
  iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0x24);
  uVar2 = Instruction::type_id(y);
  pTVar5 = analysis::TypeManager::GetType(tm,uVar2);
  iVar4 = (*pTVar5->_vptr_Type[9])(pTVar5);
  if (iVar3 == *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x24)) {
    uVar2 = Instruction::type_id(x);
    init_list._M_len = 1;
    init_list._M_array = &local_1ac;
    local_1ac = uVar1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_130,init_list);
    uVar7 = 1;
    local_f0._0_4_ = uVar7;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_f0 + 8),&local_130);
    local_1b0 = 0x26;
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_1b0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_158,init_list_00);
    local_c0 = 7;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,&local_158);
    local_1b4 = Instruction::result_id(x);
    init_list_01._M_len = 1;
    init_list_01._M_array = &local_1b4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_180,init_list_01);
    local_90 = uVar7;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_180);
    local_1b8 = Instruction::result_id(y);
    init_list_02._M_len = 1;
    init_list_02._M_array = &local_1b8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1a8,init_list_02);
    local_60 = uVar7;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_1a8);
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_108,
               local_f0,&stack0xffffffffffffffd0);
    pIVar6 = InsertInst(this,where,OpExtInst,uVar2,result_id,(OperandList *)&local_108);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_108
              );
    lVar8 = 0x98;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_f0 + lVar8));
      lVar8 = lVar8 + -0x30;
    } while (lVar8 != -0x28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1a8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_180);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_158);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_130);
    return pIVar6;
  }
  __assert_fail("xwidth == ywidth",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                ,0x26e,
                "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeUMinInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *)"
               );
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeUMinInst(
    const analysis::TypeManager& tm, Instruction* x, Instruction* y,
    Instruction* where) {
  // Get IDs of instructions we'll be referencing. Evaluate them before calling
  // the function so we force a deterministic ordering in case both of them need
  // to take a new ID.
  const uint32_t glsl_insts_id = GetGlslInsts();
  uint32_t smin_id = TakeNextId();
  const auto xwidth = tm.GetType(x->type_id())->AsInteger()->width();
  const auto ywidth = tm.GetType(y->type_id())->AsInteger()->width();
  assert(xwidth == ywidth);
  (void)xwidth;
  (void)ywidth;
  auto* smin_inst = InsertInst(
      where, spv::Op::OpExtInst, x->type_id(), smin_id,
      {
          {SPV_OPERAND_TYPE_ID, {glsl_insts_id}},
          {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {GLSLstd450UMin}},
          {SPV_OPERAND_TYPE_ID, {x->result_id()}},
          {SPV_OPERAND_TYPE_ID, {y->result_id()}},
      });
  return smin_inst;
}